

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_params.c
# Opt level: O2

size_t bignParamsEnc_internal(octet *der,bign_params *params)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  octet *poVar6;
  octet *poVar7;
  der_anchor_t CurveSeq [1];
  der_anchor_t FieldSeq [1];
  der_anchor_t ParamSeq [1];
  
  sVar1 = derTSEQEncStart(ParamSeq,der,0,0x30);
  poVar6 = der + sVar1;
  if (der == (octet *)0x0) {
    poVar6 = (octet *)0x0;
  }
  sVar2 = derTSIZEEnc(poVar6,2,1);
  poVar7 = poVar6 + sVar2;
  if (poVar6 == (octet *)0x0) {
    poVar7 = (octet *)0x0;
  }
  sVar3 = derTSEQEncStart(FieldSeq,poVar7,sVar2 + sVar1,0x30);
  poVar6 = poVar7 + sVar3;
  if (poVar7 == (octet *)0x0) {
    poVar6 = (octet *)0x0;
  }
  sVar4 = derOIDEnc(poVar6,"1.2.112.0.2.0.34.101.45.4.1");
  poVar7 = poVar6 + sVar4;
  if (poVar6 == (octet *)0x0) {
    poVar7 = (octet *)0x0;
  }
  sVar5 = derTUINTEnc(poVar7,2,params->p,params->l >> 2);
  poVar6 = poVar7 + sVar5;
  if (poVar7 == (octet *)0x0) {
    poVar6 = (octet *)0x0;
  }
  sVar5 = sVar5 + sVar4 + sVar3 + sVar2 + sVar1;
  sVar1 = derTSEQEncStop(poVar6,sVar5,FieldSeq);
  poVar7 = poVar6 + sVar1;
  if (poVar6 == (octet *)0x0) {
    poVar7 = (octet *)0x0;
  }
  sVar1 = sVar1 + sVar5;
  sVar2 = derTSEQEncStart(CurveSeq,poVar7,sVar1,0x30);
  poVar6 = poVar7 + sVar2;
  if (poVar7 == (octet *)0x0) {
    poVar6 = (octet *)0x0;
  }
  sVar3 = derEnc(poVar6,4,params->a,params->l >> 2);
  poVar7 = poVar6 + sVar3;
  if (poVar6 == (octet *)0x0) {
    poVar7 = (octet *)0x0;
  }
  sVar4 = derEnc(poVar7,4,params->b,params->l >> 2);
  poVar6 = poVar7 + sVar4;
  if (poVar7 == (octet *)0x0) {
    poVar6 = (octet *)0x0;
  }
  sVar5 = derTBITEnc(poVar6,3,params->seed,0x40);
  poVar7 = poVar6 + sVar5;
  if (poVar6 == (octet *)0x0) {
    poVar7 = (octet *)0x0;
  }
  sVar5 = sVar5 + sVar4 + sVar3 + sVar2 + sVar1;
  sVar1 = derTSEQEncStop(poVar7,sVar5,CurveSeq);
  poVar6 = poVar7 + sVar1;
  if (poVar7 == (octet *)0x0) {
    poVar6 = (octet *)0x0;
  }
  sVar2 = derEnc(poVar6,4,params->yG,params->l >> 2);
  poVar7 = poVar6 + sVar2;
  if (poVar6 == (octet *)0x0) {
    poVar7 = (octet *)0x0;
  }
  sVar3 = derTUINTEnc(poVar7,2,params->q,params->l >> 2);
  poVar6 = poVar7 + sVar3;
  if (poVar7 == (octet *)0x0) {
    poVar6 = (octet *)0x0;
  }
  sVar3 = sVar3 + sVar2 + sVar1 + sVar5;
  sVar1 = derTSEQEncStop(poVar6,sVar3,ParamSeq);
  return sVar1 + sVar3;
}

Assistant:

static size_t bignParamsEnc_internal(octet der[], const bign_params* params)
{
	der_anchor_t ParamSeq[1];
	der_anchor_t FieldSeq[1];
	der_anchor_t CurveSeq[1];
	size_t count = 0;
	// начать кодирование...
	derEncStep(derSEQEncStart(ParamSeq, der, count), der, count);
	 // ...version...
	 derEncStep(derSIZEEnc(der, 1), der, count);
	 // ...FieldID...
	 derEncStep(derSEQEncStart(FieldSeq, der, count), der, count);
	  derEncStep(derOIDEnc(der, oid_bign_primefield), der, count);
	  derEncStep(derUINTEnc(der, params->p, params->l / 4), der, count);
	 derEncStep(derSEQEncStop(der, count, FieldSeq), der, count);
	 // ...Curve...
	 derEncStep(derSEQEncStart(CurveSeq, der, count), der, count);
	  derEncStep(derOCTEnc(der, params->a, params->l / 4), der, count);
	  derEncStep(derOCTEnc(der, params->b, params->l / 4), der, count);
	  derEncStep(derBITEnc(der, params->seed, 64), der, count);
	 derEncStep(derSEQEncStop(der, count, CurveSeq), der, count);
	 // ...base...
	 derEncStep(derOCTEnc(der, params->yG, params->l / 4), der, count);
	 // ...order...
	 derEncStep(derUINTEnc(der, params->q, params->l / 4), der, count);
	 // ...завершить кодирование
	derEncStep(derSEQEncStop(der, count, ParamSeq), der, count);
	// возвратить длину DER-кода
	return count;
}